

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  SPxOut *pSVar1;
  undefined4 uVar2;
  DataArray<int> *pDVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Verbosity VVar8;
  int *piVar9;
  char *pcVar10;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar11;
  element_type *peVar12;
  bool *pbVar13;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  ulong *puVar16;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  undefined1 *in_RDX;
  DataArray<int> *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_6;
  int j_5;
  DataArray<int> da_perm;
  int j_4;
  int j_3;
  int *perm;
  int nColsOld;
  int j_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_5;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_4;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_3;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objDif;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cj2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cj1;
  int j2;
  int j1;
  int m_1;
  int l_1;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int k_4;
  DataArray<int> m_perm_empty;
  bool hasDuplicateCol;
  int k_3;
  int k_2;
  DataArray<bool> fixAndRemCol;
  DataArray<bool> remCol;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int j_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldVal;
  int j;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Result ret;
  int remNzos;
  int remCols;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  DuplicateColsPS *in_stack_ffffffffffffe058;
  DuplicateColsPS *pDVar17;
  undefined4 in_stack_ffffffffffffe060;
  undefined4 in_stack_ffffffffffffe064;
  int in_stack_ffffffffffffe068;
  int in_stack_ffffffffffffe06c;
  undefined7 in_stack_ffffffffffffe070;
  undefined1 in_stack_ffffffffffffe077;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe098;
  int **in_stack_ffffffffffffe0a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe0c8;
  undefined4 in_stack_ffffffffffffe0d0;
  undefined4 in_stack_ffffffffffffe0d4;
  uint uVar18;
  double in_stack_ffffffffffffe0e0;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffe0e8;
  undefined2 uVar19;
  DataArray<int> *in_stack_ffffffffffffe0f0;
  undefined4 in_stack_ffffffffffffe0f8;
  int in_stack_ffffffffffffe0fc;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe100;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe108;
  DuplicateColsPS *in_stack_ffffffffffffe110;
  DataArray<int> *in_stack_ffffffffffffe118;
  undefined4 in_stack_ffffffffffffe120;
  int in_stack_ffffffffffffe124;
  undefined7 in_stack_ffffffffffffe140;
  undefined1 in_stack_ffffffffffffe147;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe148;
  undefined5 in_stack_ffffffffffffe150;
  undefined1 in_stack_ffffffffffffe155;
  undefined1 in_stack_ffffffffffffe156;
  undefined1 in_stack_ffffffffffffe157;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffe170;
  type_conflict5 local_1e43;
  type_conflict5 local_1dd2;
  type_conflict5 local_1d6b;
  type_conflict5 local_1d12;
  type_conflict5 local_1cba;
  undefined6 in_stack_ffffffffffffe3a0;
  undefined1 in_stack_ffffffffffffe3a6;
  undefined1 in_stack_ffffffffffffe3a7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe3a8;
  undefined1 *in_stack_ffffffffffffe3b0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe3b8;
  FixBoundsPS *in_stack_ffffffffffffe3c0;
  type_conflict5 local_1c02;
  bool local_1b6a;
  bool local_1aad;
  undefined1 local_1a0c [56];
  undefined4 local_19d4;
  undefined4 in_stack_ffffffffffffe630;
  undefined4 in_stack_ffffffffffffe634;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe638;
  undefined8 local_19a0;
  undefined1 local_1998 [76];
  uint local_194c;
  DataArray<int> local_1948;
  fpclass_type local_1930;
  int local_192c;
  long local_1928;
  uint local_191c;
  uint local_1918;
  undefined1 local_18dc [56];
  undefined1 local_18a4 [59];
  undefined1 local_1869;
  DLPSV *local_1810;
  undefined1 local_1804 [7];
  undefined1 in_stack_ffffffffffffe803;
  uint in_stack_ffffffffffffe804;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe808;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe810;
  shared_ptr<soplex::Tolerances> local_17b0 [4];
  undefined1 local_1764 [56];
  undefined4 local_172c;
  fpclass_type local_1728;
  undefined1 local_1724 [59];
  undefined1 local_16e9;
  undefined1 local_16d8 [72];
  ulong local_1690;
  undefined1 local_1684 [56];
  undefined4 local_164c;
  undefined4 local_1648;
  undefined1 local_1641;
  undefined1 local_1630 [76];
  undefined4 local_15e4;
  undefined1 local_15e0 [56];
  undefined4 local_15a8;
  undefined4 local_15a4;
  ulong local_15a0;
  undefined1 local_1598 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1560;
  undefined1 local_1528 [56];
  undefined1 local_14f0 [56];
  ulong local_14b8;
  undefined1 local_14b0 [56];
  undefined1 local_1478 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1440;
  undefined1 local_1408 [56];
  ulong local_13d0;
  undefined1 local_13c8 [56];
  undefined1 local_1390 [56];
  ulong local_1358;
  undefined1 local_134c [56];
  undefined4 local_1314;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1310;
  undefined1 local_12d8 [56];
  undefined1 local_12a0 [56];
  undefined1 local_1268 [56];
  undefined1 local_1230 [56];
  undefined1 local_11f8 [352];
  undefined1 local_1098 [79];
  byte local_1049;
  uint local_1038 [3];
  undefined1 local_102c [56];
  undefined1 local_ff4 [59];
  byte local_fb9;
  uint local_fa8 [3];
  undefined1 local_f9c [56];
  undefined1 local_f64 [59];
  byte local_f29;
  undefined8 local_f18;
  undefined1 local_f10 [56];
  undefined1 local_ed8 [72];
  undefined8 local_e90;
  undefined1 local_e84 [56];
  undefined1 local_e4c [112];
  undefined1 local_ddc [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_da4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d6c;
  undefined1 local_d34 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cfc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cc4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8c;
  int local_c54;
  int local_c50;
  uint local_c4c;
  uint local_c48;
  undefined1 local_c41;
  undefined1 local_c40 [256];
  DataArray<bool> local_b40 [3];
  undefined1 local_af0 [56];
  undefined1 local_ab8 [56];
  uint local_a80;
  int local_a7c;
  Real local_a68;
  undefined1 local_a60 [112];
  int local_9f0;
  uint local_9ec;
  undefined1 local_9e8 [56];
  undefined8 local_9b0;
  int local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a4;
  uint local_96c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_968;
  int local_95c;
  undefined8 local_958;
  undefined1 local_950 [56];
  undefined8 local_918;
  int local_90c;
  undefined8 local_908;
  IdxSet local_900;
  int *local_8d8;
  DataArray<int> local_8a8;
  DataArray<int> local_890;
  Result local_874;
  int local_870;
  int local_86c;
  undefined1 *local_868;
  DataArray<int> *local_860;
  Result local_84c;
  undefined8 local_848;
  undefined8 *local_840;
  undefined1 *local_838;
  undefined8 local_830;
  Real *local_828;
  undefined1 *local_820;
  undefined8 local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  undefined8 local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined8 *local_7e0;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined8 *local_7c8;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  uint *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_7a0;
  uint *local_798;
  undefined1 *local_790;
  undefined8 local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  undefined8 local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  undefined8 local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined1 *local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined1 *local_700;
  undefined8 local_6f8;
  ulong *local_6f0;
  undefined1 *local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  ulong *local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  ulong *local_690;
  undefined1 *local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined1 *local_670;
  undefined8 local_668;
  ulong *local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  ulong *local_630;
  undefined1 *local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  DLPSV **local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 *local_5d0;
  undefined1 *local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_590;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  undefined1 *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  undefined1 *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  undefined1 *local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_530;
  undefined1 *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  undefined1 *local_518;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_510;
  undefined1 *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  undefined1 *local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f0;
  shared_ptr<soplex::Tolerances> *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d8;
  cpp_dec_float<50U,_int,_void> *local_4d0;
  undefined1 *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  undefined1 *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  undefined1 *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  undefined8 *local_490;
  DLPSV **local_488;
  undefined8 local_480;
  undefined8 local_478;
  ulong *local_470;
  undefined8 local_468;
  ulong *local_460;
  undefined8 local_458;
  ulong *local_450;
  undefined8 local_448;
  ulong *local_440;
  undefined8 local_438;
  ulong *local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  uint *local_3f8;
  uint *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  Real *local_3c8;
  undefined8 *local_3c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3b1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_371;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_331;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  undefined1 *local_300;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2f1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2b1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_271;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_231;
  FixBoundsPS *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_220;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_218;
  FixBoundsPS *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined8 *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined8 *local_190;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_181;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_141;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  uint *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  uint *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_86c = 0;
  local_870 = 0;
  local_868 = in_RDX;
  local_860 = in_RSI;
  local_874 = removeEmpty(in_stack_ffffffffffffe638,
                          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
  local_84c = local_874;
  if (local_874 == OKAY) {
    iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3dda83);
    if (iVar6 < 2) {
      local_84c = OKAY;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3ddaa5);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3ddacb);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3ddb01);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
              in_stack_ffffffffffffe06c);
      local_8d8 = (int *)0x0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3ddb39);
      spx_alloc<int*>(in_stack_ffffffffffffe0a0,(int)((ulong)in_stack_ffffffffffffe098 >> 0x20));
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3ddc70);
      IdxSet::IdxSet(&local_900,iVar6,local_8d8,0);
      piVar9 = DataArray<int>::operator[](&local_890,0);
      *piVar9 = 0;
      local_908 = 0;
      local_198 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
      local_1a0 = &local_908;
      local_190 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffe0e8,in_stack_ffffffffffffe0e0);
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3ddd27);
      piVar9 = DataArray<int>::operator[](&local_8a8,0);
      *piVar9 = iVar6;
      for (local_90c = 1; iVar6 = local_90c,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3ddd6e), iVar6 < iVar7; local_90c = local_90c + 1) {
        piVar9 = DataArray<int>::operator[](&local_890,local_90c);
        *piVar9 = 0;
        local_918 = 0;
        local_1b0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
        local_1b8 = &local_918;
        local_1a8 = local_1b8;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_ffffffffffffe0e8,in_stack_ffffffffffffe0e0);
        piVar9 = DataArray<int>::operator[](&local_8a8,local_90c);
        *piVar9 = 0;
        IdxSet::addIdx(&local_900,local_90c);
      }
      local_958 = 0;
      local_838 = local_950;
      local_840 = &local_958;
      local_848 = 0;
      local_3c0 = local_840;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      for (local_95c = 0; iVar6 = local_95c,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3ddf11), iVar6 < iVar7; local_95c = local_95c + 1) {
        local_968 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
        for (local_96c = 0; uVar18 = local_96c,
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_968), (int)uVar18 < iVar6; local_96c = local_96c + 1) {
          local_5c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value(local_968,local_96c);
          local_5b8 = &local_9a4;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
          pcVar10 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_968,(char *)(ulong)local_96c,__c);
          local_9a8 = (int)pcVar10;
          Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          local_9b0 = 0;
          tVar4 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffe058,(double *)0x3de021);
          if (tVar4) {
            local_498 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
            local_4a0 = &local_9a4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                       (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
          }
          DataArray<int>::operator[](&local_890,local_9a8);
          Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          local_330 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          local_328 = &local_9a4;
          local_320 = local_9e8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_331,local_328,local_330);
          local_318 = local_9e8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
          local_308 = local_328;
          local_310 = local_330;
          local_300 = local_9e8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058,
                     (cpp_dec_float<50U,_int,_void> *)0x3de18b);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                in_stack_ffffffffffffe06c,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
          piVar9 = DataArray<int>::operator[](&local_890,local_9a8);
          piVar9 = DataArray<int>::operator[](&local_8a8,*piVar9);
          iVar6 = *piVar9;
          *piVar9 = iVar6 + -1;
          if (iVar6 + -1 == 0) {
            piVar9 = DataArray<int>::operator[](&local_890,local_9a8);
            IdxSet::addIdx(&local_900,*piVar9);
          }
        }
        for (local_9ec = 0; uVar18 = local_9ec,
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_968), (int)uVar18 < iVar6; local_9ec = local_9ec + 1) {
          pcVar10 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_968,(char *)(ulong)local_9ec,__c_00);
          piVar9 = DataArray<int>::operator[](&local_890,(int)pcVar10);
          local_9f0 = *piVar9;
          pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(&pDVar11->
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
          if (0 < iVar6) {
            SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe058);
            peVar12 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x3de2d7);
            local_a68 = Tolerances::epsilon(peVar12);
            local_820 = local_a60;
            local_828 = &local_a68;
            local_830 = 0;
            local_3c8 = local_828;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                       (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                       (type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
            ElementCompare::ElementCompare
                      ((ElementCompare *)
                       CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x3de37d);
            pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
            iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar11->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            iVar6 = extraout_EDX;
            if (1 < iVar7) {
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::mem(&pDVar11->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(&pDVar11->
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (in_stack_ffffffffffffe100,in_stack_ffffffffffffe0fc,
                         (ElementCompare *)in_stack_ffffffffffffe0f0,
                         (int)((ulong)in_stack_ffffffffffffe0e8 >> 0x20),
                         SUB81((ulong)in_stack_ffffffffffffe0e8 >> 0x18,0));
              iVar6 = extraout_EDX_00;
            }
            pcVar10 = IdxSet::index(&local_900,(char *)0x0,iVar6);
            local_a7c = (int)pcVar10;
            IdxSet::remove(&local_900,(char *)0x0);
            local_a80 = 0;
            while( true ) {
              uVar18 = local_a80;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar11->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar7 = (int)((ulong)in_stack_ffffffffffffe058 >> 0x20);
              if (iVar6 <= (int)uVar18) break;
              local_1aad = false;
              iVar6 = extraout_EDX_01;
              if (local_a80 != 0) {
                pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),iVar7);
                local_5b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(&pDVar11->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,local_a80);
                local_5a8 = local_ab8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                local_598 = local_af0;
                local_5a0 = local_950;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                epsZero(in_stack_ffffffffffffe098);
                local_1aad = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT17(in_stack_ffffffffffffe157,
                                                    CONCAT16(in_stack_ffffffffffffe156,
                                                             CONCAT15(in_stack_ffffffffffffe155,
                                                                      in_stack_ffffffffffffe150))),
                                        in_stack_ffffffffffffe148,
                                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT17(in_stack_ffffffffffffe147,
                                                    in_stack_ffffffffffffe140));
                iVar6 = extraout_EDX_02;
              }
              if (local_1aad != false) {
                pcVar10 = IdxSet::index(&local_900,(char *)0x0,iVar6);
                local_a7c = (int)pcVar10;
                IdxSet::remove(&local_900,(char *)0x0);
              }
              iVar6 = local_a7c;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar11->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_a80,__c_01);
              piVar9 = DataArray<int>::operator[](&local_890,*piVar9);
              *piVar9 = iVar6;
              piVar9 = DataArray<int>::operator[](&local_8a8,local_a7c);
              *piVar9 = *piVar9 + 1;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              local_4b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::value(&pDVar11->
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,local_a80);
              local_4a8 = local_950;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
              local_a80 = local_a80 + 1;
            }
            Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),iVar7);
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3de6f0);
          }
        }
      }
      spx_free<int*>((int **)0x3de72d);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3de73a);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3de770);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      for (local_c40._228_4_ = 0; uVar2 = local_c40._228_4_,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3de7bf), (int)uVar2 < iVar6;
          local_c40._228_4_ = local_c40._228_4_ + 1) {
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                     (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3de801);
      }
      for (local_c40._224_4_ = 0; uVar2 = local_c40._224_4_,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3de86c), (int)uVar2 < iVar6;
          local_c40._224_4_ = local_c40._224_4_ + 1) {
        pbVar13 = DataArray<bool>::operator[](local_b40,local_c40._224_4_);
        *pbVar13 = false;
        pbVar13 = DataArray<bool>::operator[]
                            ((DataArray<bool> *)(local_c40 + 0xe8),local_c40._224_4_);
        *pbVar13 = false;
        DataArray<int>::operator[](&local_890,local_c40._224_4_);
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                     (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
        local_c40._160_4_ = 0;
        local_c40._164_4_ = 0;
        local_808 = local_c40 + 0xa8;
        local_810 = local_c40 + 0xa0;
        local_818 = 0;
        local_3d0 = local_810;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                   (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
              in_stack_ffffffffffffe06c,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      }
      local_c40[0x9f] = 0;
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      for (local_c40._124_4_ = 0; uVar2 = local_c40._124_4_,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x3de9f3), (int)uVar2 < iVar6;
          local_c40._124_4_ = local_c40._124_4_ + 1) {
        pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
        iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar11->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar6) {
          pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar11->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_02);
          pSVar14 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar14);
          if (iVar6 != 1) {
            pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
            local_c40._120_4_ =
                 SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::size(&pDVar11->
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
            SPxOut::
            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[37],_int,_0>
                      (in_RDI,(char (*) [37])"IMAISM58 {} duplicate columns found\n",
                       (int *)(local_c40 + 0x78));
            if ((local_c40[0x9f] & 1) == 0) {
              operator_new(0x168);
              local_c41 = 1;
              local_c40._40_4_ = 0;
              local_c40._44_4_ = 0x3ff00000;
              local_7f0 = local_c40 + 0x30;
              local_7f8 = local_c40 + 0x28;
              local_800 = 0;
              local_3d8 = local_7f8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                         (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                         (type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
              DataArray<int>::DataArray
                        ((DataArray<int> *)
                         CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                         (DataArray<int> *)
                         CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068));
              pDVar17 = (DuplicateColsPS *)local_c40;
              std::shared_ptr<soplex::Tolerances>::shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)
                         CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                         (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
              in_stack_ffffffffffffe068 = 0;
              in_stack_ffffffffffffe060 = 1;
              DuplicateColsPS::DuplicateColsPS
                        (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
                         (int)((ulong)in_stack_ffffffffffffe100 >> 0x20),
                         (int)in_stack_ffffffffffffe100,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe0fc,in_stack_ffffffffffffe0f8),
                         in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe170,
                         SUB81((ulong)in_stack_ffffffffffffe0e8 >> 0x38,0),
                         SUB81((ulong)in_stack_ffffffffffffe0e8 >> 0x30,0));
              local_c41 = 0;
              std::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
              ::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                        ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),pDVar17);
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x3dec4d);
              DataArray<int>::~DataArray
                        ((DataArray<int> *)
                         CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
              Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
              ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                       (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                        *)pDVar17);
              local_c40[0x9f] = 1;
              std::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
              ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                             *)0x3dec8d);
              in_stack_ffffffffffffe058 = pDVar17;
            }
            local_c48 = 0;
            while( true ) {
              uVar18 = local_c48;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar11->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              if (iVar6 <= (int)uVar18) break;
              local_c4c = 0;
              while( true ) {
                uVar18 = local_c4c;
                pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::size(&pDVar11->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
                if (iVar6 <= (int)uVar18) break;
                pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::index(&pDVar11->
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ,(char *)(ulong)local_c48,__c_03);
                local_c50 = *piVar9;
                pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::index(&pDVar11->
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ,(char *)(ulong)local_c4c,__c_04);
                local_c54 = *piVar9;
                if (((local_c48 != local_c4c) &&
                    (pbVar13 = DataArray<bool>::operator[](local_b40,local_c50),
                    (*pbVar13 & 1U) == 0)) &&
                   (pbVar13 = DataArray<bool>::operator[](local_b40,local_c54), (*pbVar13 & 1U) == 0
                   )) {
                  local_590 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_588 = &local_c8c;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                  local_580 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_578 = &local_cc4;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                  pnVar15 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(in_stack_ffffffffffffe064,
                                                     in_stack_ffffffffffffe060),
                                         (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_370 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffe064,
                                                       in_stack_ffffffffffffe060),
                                           (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_368 = pnVar15;
                  local_360 = &local_cfc;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_371,pnVar15,local_370);
                  local_358 = &local_cfc;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
                  local_348 = local_368;
                  local_350 = local_370;
                  local_340 = &local_cfc;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058,
                             (cpp_dec_float<50U,_int,_void> *)0x3df007);
                  local_1f0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffe064,
                                                       in_stack_ffffffffffffe060),
                                           (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_1e8 = &local_cc4;
                  local_1e0 = &local_da4;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1f1,local_1e8,local_1f0);
                  local_1d8 = &local_da4;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
                  local_1c8 = local_1e8;
                  local_1d0 = local_1f0;
                  local_1c0 = &local_da4;
                  boost::multiprecision::default_ops::
                  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058,
                             (cpp_dec_float<50U,_int,_void> *)0x3df0d6);
                  local_3b0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffe064,
                                                       in_stack_ffffffffffffe060),
                                           (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                  local_3a8 = &local_da4;
                  local_3a0 = &local_d6c;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_3b1,local_3a8,local_3b0);
                  local_398 = &local_d6c;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
                  local_388 = local_3a8;
                  local_390 = local_3b0;
                  local_380 = &local_d6c;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058,
                             (cpp_dec_float<50U,_int,_void> *)0x3df1a5);
                  local_178 = &local_c8c;
                  local_180 = &local_d6c;
                  local_170 = local_d34;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_181,local_178,local_180);
                  local_168 = local_d34;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
                  local_158 = local_178;
                  local_160 = local_180;
                  local_150 = local_d34;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058,
                             (cpp_dec_float<50U,_int,_void> *)0x3df268);
                  local_568 = local_ddc;
                  local_570 = local_d34;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                  epsZero(in_stack_ffffffffffffe098);
                  bVar5 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0
                                                ),in_stack_ffffffffffffe0c8);
                  iVar6 = (int)((ulong)in_stack_ffffffffffffe058 >> 0x20);
                  if (bVar5) {
                    local_f29 = 0;
                    local_fb9 = 0;
                    local_1049 = 0;
                    local_560 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060),iVar6);
                    local_558 = local_e4c;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                    local_e90 = 0;
                    local_7d8 = local_e84;
                    local_7e0 = &local_e90;
                    local_7e8 = 0;
                    local_3e0 = local_7e0;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                               (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)
                               ,(type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe058);
                    peVar12 = std::
                              __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x3df3e4);
                    Tolerances::epsilon(peVar12);
                    bVar5 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffe110,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffe108,
                                       (double)in_stack_ffffffffffffe100);
                    local_1b6a = false;
                    if (bVar5) {
                      local_550 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060),
                                          (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                      local_548 = local_ed8;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                      local_f18 = 0;
                      local_7c0 = local_f10;
                      local_7c8 = &local_f18;
                      local_7d0 = 0;
                      local_3e8 = local_7c8;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<50U,_int,_void> *)
                                 CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                 (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                  in_stack_ffffffffffffe068),
                                 (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                  in_stack_ffffffffffffe060));
                      SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffe058);
                      local_f29 = 1;
                      peVar12 = std::
                                __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x3df526);
                      Tolerances::epsilon(peVar12);
                      bVar5 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffe124,
                                                     in_stack_ffffffffffffe120),
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffe118,
                                         (double)in_stack_ffffffffffffe110);
                      local_1b6a = false;
                      if (bVar5) {
                        local_540 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                        local_538 = local_f64;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                      (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                        local_fa8[0] = 0;
                        local_fa8[1] = 0;
                        local_7a8 = local_f9c;
                        local_7b0 = local_fa8;
                        local_7b8 = 0;
                        local_3f0 = local_7b0;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                   (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                    in_stack_ffffffffffffe068),
                                   (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060));
                        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe058);
                        local_fb9 = 1;
                        peVar12 = std::
                                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x3df668);
                        Tolerances::epsilon(peVar12);
                        bVar5 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffe110,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffe108,
                                           (double)in_stack_ffffffffffffe100);
                        local_1b6a = false;
                        if (bVar5) {
                          local_530 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          local_528 = local_ff4;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),
                                        (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                          local_1038._0_8_ = 0;
                          local_790 = local_102c;
                          local_798 = local_1038;
                          local_7a0 = 0;
                          local_3f8 = local_798;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffe058);
                          local_1049 = 1;
                          peVar12 = std::
                                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x3df7aa);
                          Tolerances::epsilon(peVar12);
                          local_1b6a = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffe124,
                                                             in_stack_ffffffffffffe120),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffe118,
                                                  (double)in_stack_ffffffffffffe110);
                        }
                      }
                    }
                    if ((local_1049 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x3df81b);
                    }
                    if ((local_fb9 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x3df834);
                    }
                    if ((local_f29 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x3df84d);
                    }
                    std::shared_ptr<soplex::Tolerances>::~shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)0x3df85a);
                    if (local_1b6a == false) {
                      SPxOut::
                      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[95],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [95])
                                        "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n"
                                 ,&local_c50,&local_c54);
                    }
                    else {
                      operator_new(0x168);
                      local_11f8[0x137] = 1;
                      local_518 = local_1098;
                      local_520 = &local_cfc;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                      DataArray<int>::DataArray
                                ((DataArray<int> *)
                                 CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                 (DataArray<int> *)
                                 CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068));
                      pDVar17 = (DuplicateColsPS *)(local_11f8 + 0x138);
                      std::shared_ptr<soplex::Tolerances>::shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
                      in_stack_ffffffffffffe068 = 0;
                      in_stack_ffffffffffffe060 = 0;
                      DuplicateColsPS::DuplicateColsPS
                                (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
                                 (int)((ulong)in_stack_ffffffffffffe100 >> 0x20),
                                 (int)in_stack_ffffffffffffe100,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe0fc,in_stack_ffffffffffffe0f8),
                                 in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe170,
                                 SUB81((ulong)in_stack_ffffffffffffe0e8 >> 0x38,0),
                                 SUB81((ulong)in_stack_ffffffffffffe0e8 >> 0x30,0));
                      local_11f8[0x137] = 0;
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                      ::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 pDVar17);
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x3df99f);
                      DataArray<int>::~DataArray
                                ((DataArray<int> *)
                                 CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
                      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                *)pDVar17);
                      local_11f8._304_4_ = 0;
                      tVar4 = boost::multiprecision::operator>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffe06c,
                                                     in_stack_ffffffffffffe068),
                                         (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                         in_stack_ffffffffffffe060));
                      if (tVar4) {
                        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                (int)((ulong)pDVar17 >> 0x20));
                        puVar16 = (ulong *)infinity();
                        local_11f8._240_8_ = *puVar16 ^ 0x8000000000000000;
                        local_778 = local_11f8 + 0xf8;
                        local_780 = local_11f8 + 0xf0;
                        local_788 = 0;
                        local_400 = local_780;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                   (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                    in_stack_ffffffffffffe068),
                                   (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060));
                        tVar4 = boost::multiprecision::operator<=
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)pDVar17,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x3dfab0);
                        local_1c02 = true;
                        if (!tVar4) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)pDVar17 >> 0x20));
                          puVar16 = (ulong *)infinity();
                          local_11f8._176_8_ = *puVar16 ^ 0x8000000000000000;
                          local_760 = local_11f8 + 0xb8;
                          local_768 = local_11f8 + 0xb0;
                          local_770 = 0;
                          local_408 = local_768;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          local_1c02 = boost::multiprecision::operator<=
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar17,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x3dfb81);
                        }
                        pDVar3 = local_860;
                        iVar6 = local_c54;
                        if (local_1c02 == false) {
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)pDVar17 >> 0x20));
                          in_stack_ffffffffffffe3c0 =
                               (FixBoundsPS *)
                               SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (int)((ulong)pDVar17 >> 0x20));
                          in_stack_ffffffffffffe3b8 =
                               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)local_11f8;
                          local_228 = &local_cfc;
                          local_230 = in_stack_ffffffffffffe3c0;
                          local_220 = in_stack_ffffffffffffe3b8;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_231,local_228,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffe3c0);
                          local_218 = in_stack_ffffffffffffe3b8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                          local_208 = local_228;
                          local_210 = local_230;
                          local_200 = in_stack_ffffffffffffe3b8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (cpp_dec_float<50U,_int,_void> *)pDVar17,
                                     (cpp_dec_float<50U,_int,_void> *)0x3dfec1);
                          in_stack_ffffffffffffe3b0 = local_11f8 + 0x38;
                          local_80 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)local_11f8;
                          local_78 = pnVar15;
                          local_70 = in_stack_ffffffffffffe3b0;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_81,pnVar15,local_80);
                          local_68 = in_stack_ffffffffffffe3b0;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                          local_58 = local_78;
                          local_60 = local_80;
                          local_50 = in_stack_ffffffffffffe3b0;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (cpp_dec_float<50U,_int,_void> *)pDVar17,
                                     (cpp_dec_float<50U,_int,_void> *)0x3dff84);
                          (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,local_11f8 + 0x38,0);
                        }
                        else {
                          puVar16 = (ulong *)infinity();
                          local_11f8._112_8_ = *puVar16 ^ 0x8000000000000000;
                          local_748 = local_11f8 + 0x78;
                          local_750 = local_11f8 + 0x70;
                          local_758 = 0;
                          local_410 = local_750;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,local_11f8 + 0x78,0);
                        }
                        in_stack_ffffffffffffe3a8 =
                             SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(int)((ulong)pDVar17 >> 0x20));
                        local_738 = infinity();
                        local_730 = local_1230;
                        local_740 = 0;
                        local_418 = local_738;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                   (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                    in_stack_ffffffffffffe068),
                                   (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060));
                        in_stack_ffffffffffffe3a7 =
                             boost::multiprecision::operator>=
                                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)pDVar17,
                                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)0x3e003e);
                        in_stack_ffffffffffffe3a6 = true;
                        if (!(bool)in_stack_ffffffffffffe3a7) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)pDVar17 >> 0x20));
                          local_720 = infinity();
                          local_718 = local_1268;
                          local_728 = 0;
                          local_420 = local_720;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          in_stack_ffffffffffffe3a6 =
                               boost::multiprecision::operator>=
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)pDVar17,
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x3e00ef);
                        }
                        pDVar3 = local_860;
                        iVar6 = local_c54;
                        if ((type_conflict5)in_stack_ffffffffffffe3a6 == false) {
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)pDVar17 >> 0x20));
                          local_270 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)pDVar17 >> 0x20));
                          local_268 = &local_cfc;
                          local_260 = &local_1310;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_271,local_268,local_270);
                          local_258 = &local_1310;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                          local_248 = local_268;
                          local_250 = local_270;
                          local_240 = &local_1310;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (cpp_dec_float<50U,_int,_void> *)pDVar17,
                                     (cpp_dec_float<50U,_int,_void> *)0x3e02c6);
                          local_c0 = &local_1310;
                          local_b8 = pnVar15;
                          local_b0 = local_12d8;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_c1,pnVar15,local_c0);
                          local_a8 = local_12d8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                          local_98 = local_b8;
                          local_a0 = local_c0;
                          local_90 = local_12d8;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (cpp_dec_float<50U,_int,_void> *)pDVar17,
                                     (cpp_dec_float<50U,_int,_void> *)0x3e0389);
                          (**(code **)(*(long *)pDVar3 + 0x168))(pDVar3,iVar6,local_12d8,0);
                        }
                        else {
                          local_708 = infinity();
                          local_700 = local_12a0;
                          local_710 = 0;
                          local_428 = local_708;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          (**(code **)(*(long *)pDVar3 + 0x168))(pDVar3,iVar6,local_12a0,0);
                        }
                      }
                      else {
                        local_1314 = 0;
                        tVar4 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068),
                                           (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                           in_stack_ffffffffffffe060));
                        if (tVar4) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)pDVar17 >> 0x20));
                          puVar16 = (ulong *)infinity();
                          local_1358 = *puVar16 ^ 0x8000000000000000;
                          local_6e8 = local_134c;
                          local_6f0 = &local_1358;
                          local_6f8 = 0;
                          local_430 = local_6f0;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          tVar4 = boost::multiprecision::operator<=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)pDVar17,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x3e04a1);
                          local_1cba = true;
                          if (!tVar4) {
                            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                    ,(int)((ulong)pDVar17 >> 0x20));
                            local_6d8 = infinity();
                            local_6d0 = local_1390;
                            local_6e0 = 0;
                            local_438 = local_6d8;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070)
                                       ,(double)CONCAT44(in_stack_ffffffffffffe06c,
                                                         in_stack_ffffffffffffe068),
                                       (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060));
                            local_1cba = boost::multiprecision::operator>=
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar17,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x3e0552);
                          }
                          pDVar3 = local_860;
                          iVar6 = local_c54;
                          if (local_1cba == false) {
                            pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)pDVar17 >> 0x20));
                            local_2b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffe064,
                                                            in_stack_ffffffffffffe060),
                                                (int)((ulong)pDVar17 >> 0x20));
                            local_2a8 = &local_cfc;
                            local_2a0 = &local_1440;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2b1,local_2a8,local_2b0);
                            local_298 = &local_1440;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060));
                            local_288 = local_2a8;
                            local_290 = local_2b0;
                            local_280 = &local_1440;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                       ,(cpp_dec_float<50U,_int,_void> *)pDVar17,
                                       (cpp_dec_float<50U,_int,_void> *)0x3e0749);
                            local_100 = &local_1440;
                            local_f8 = pnVar15;
                            local_f0 = local_1408;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_101,pnVar15,local_100);
                            local_e8 = local_1408;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060));
                            local_d8 = local_f8;
                            local_e0 = local_100;
                            local_d0 = local_1408;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                       ,(cpp_dec_float<50U,_int,_void> *)pDVar17,
                                       (cpp_dec_float<50U,_int,_void> *)0x3e080c);
                            (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,local_1408,0);
                          }
                          else {
                            puVar16 = (ulong *)infinity();
                            local_13d0 = *puVar16 ^ 0x8000000000000000;
                            local_6b8 = local_13c8;
                            local_6c0 = &local_13d0;
                            local_6c8 = 0;
                            local_440 = local_6c0;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070)
                                       ,(double)CONCAT44(in_stack_ffffffffffffe06c,
                                                         in_stack_ffffffffffffe068),
                                       (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060));
                            (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,local_13c8,0);
                          }
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)pDVar17 >> 0x20));
                          local_6a8 = infinity();
                          local_6a0 = local_1478;
                          local_6b0 = 0;
                          local_448 = local_6a8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          tVar4 = boost::multiprecision::operator>=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)pDVar17,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x3e08c6);
                          local_1d12 = true;
                          if (!tVar4) {
                            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                    ,(int)((ulong)pDVar17 >> 0x20));
                            puVar16 = (ulong *)infinity();
                            local_14b8 = *puVar16 ^ 0x8000000000000000;
                            local_688 = local_14b0;
                            local_690 = &local_14b8;
                            local_698 = 0;
                            local_450 = local_690;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070)
                                       ,(double)CONCAT44(in_stack_ffffffffffffe06c,
                                                         in_stack_ffffffffffffe068),
                                       (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060));
                            local_1d12 = boost::multiprecision::operator<=
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar17,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x3e0997);
                          }
                          pDVar3 = local_860;
                          iVar6 = local_c54;
                          if (local_1d12 == false) {
                            pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)pDVar17 >> 0x20));
                            local_2f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffe064,
                                                            in_stack_ffffffffffffe060),
                                                (int)((ulong)pDVar17 >> 0x20));
                            local_2e8 = &local_cfc;
                            local_2e0 = &local_1560;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2f1,local_2e8,local_2f0);
                            local_2d8 = &local_1560;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060));
                            local_2c8 = local_2e8;
                            local_2d0 = local_2f0;
                            local_2c0 = &local_1560;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                       ,(cpp_dec_float<50U,_int,_void> *)pDVar17,
                                       (cpp_dec_float<50U,_int,_void> *)0x3e0b6e);
                            local_140 = &local_1560;
                            local_138 = pnVar15;
                            local_130 = local_1528;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_141,pnVar15,local_140);
                            local_128 = local_1528;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060));
                            local_118 = local_138;
                            local_120 = local_140;
                            local_110 = local_1528;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                       ,(cpp_dec_float<50U,_int,_void> *)pDVar17,
                                       (cpp_dec_float<50U,_int,_void> *)0x3e0c31);
                            (**(code **)(*(long *)pDVar3 + 0x168))(pDVar3,iVar6,local_1528,0);
                          }
                          else {
                            local_678 = infinity();
                            local_670 = local_14f0;
                            local_680 = 0;
                            local_458 = local_678;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070)
                                       ,(double)CONCAT44(in_stack_ffffffffffffe06c,
                                                         in_stack_ffffffffffffe068),
                                       (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060));
                            (**(code **)(*(long *)pDVar3 + 0x168))(pDVar3,iVar6,local_14f0,0);
                          }
                        }
                      }
                      SPxOut::
                      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[55],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [55])
                                        "IMAISM60 two duplicate columns {}, {} replaced by one\n",
                                 &local_c50,&local_c54);
                      pbVar13 = DataArray<bool>::operator[](local_b40,local_c50);
                      *pbVar13 = true;
                      piVar9 = DataArray<int>::operator[](&in_RDI->m_stat,0xe);
                      *piVar9 = *piVar9 + 1;
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                     *)0x3e0ccc);
                      in_stack_ffffffffffffe058 = pDVar17;
                    }
                  }
                  else {
                    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),iVar6);
                    puVar16 = (ulong *)infinity();
                    local_15a0 = *puVar16 ^ 0x8000000000000000;
                    local_658 = local_1598;
                    local_660 = &local_15a0;
                    local_668 = 0;
                    local_460 = local_660;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                               (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)
                               ,(type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ));
                    tVar4 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffe058,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)0x3e0da8);
                    if (tVar4) {
                      local_15a4 = 0;
                      tVar4 = boost::multiprecision::operator>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffe06c,
                                                     in_stack_ffffffffffffe068),
                                         (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                         in_stack_ffffffffffffe060));
                      local_1d6b = false;
                      if (tVar4) {
                        local_15a8 = 0;
                        local_1d6b = boost::multiprecision::operator>
                                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)CONCAT44(in_stack_ffffffffffffe06c,
                                                            in_stack_ffffffffffffe068),
                                                (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                                in_stack_ffffffffffffe060));
                      }
                      if (local_1d6b == false) {
                        local_1648 = 0;
                        tVar4 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068),
                                           (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                           in_stack_ffffffffffffe060));
                        local_1dd2 = false;
                        if (tVar4) {
                          local_164c = 0;
                          local_1dd2 = boost::multiprecision::operator<
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffe06c,
                                                             in_stack_ffffffffffffe068),
                                                  (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                                  in_stack_ffffffffffffe060));
                        }
                        if (local_1dd2 != false) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          puVar16 = (ulong *)infinity();
                          local_1690 = *puVar16 ^ 0x8000000000000000;
                          local_628 = local_1684;
                          local_630 = &local_1690;
                          local_638 = 0;
                          local_470 = local_630;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          tVar4 = boost::multiprecision::operator<=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffe058,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x3e12a6);
                          if (tVar4) {
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                      (in_RDI,(char (*) [23])"IMAISM76 LP unbounded\n");
                            local_84c = UNBOUNDED;
                            local_15e4 = 1;
                            goto LAB_003e2682;
                          }
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                    (in_RDI,(char (*) [73])
                                            "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                     ,&local_c50,&local_c54,pnVar15);
                          operator_new(0x30);
                          local_16e9 = 1;
                          local_500 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          local_4f8 = local_16d8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),
                                        (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                          std::shared_ptr<soplex::Tolerances>::shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
                          FixBoundsPS::FixBoundsPS
                                    (in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,
                                     (int)((ulong)in_stack_ffffffffffffe3b0 >> 0x20),
                                     in_stack_ffffffffffffe3a8,
                                     (shared_ptr<soplex::Tolerances> *)
                                     CONCAT17(in_stack_ffffffffffffe3a7,
                                              CONCAT16(in_stack_ffffffffffffe3a6,
                                                       in_stack_ffffffffffffe3a0)));
                          local_16e9 = 0;
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                          ::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(FixBoundsPS *)in_stack_ffffffffffffe058);
                          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)0x3e143b);
                          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)in_stack_ffffffffffffe058);
                          pDVar3 = local_860;
                          iVar6 = local_c50;
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          (**(code **)(*(long *)pDVar3 + 0x168))(pDVar3,iVar6,pnVar15,0);
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                         *)0x3e14ba);
                        }
                      }
                      else {
                        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                        local_648 = infinity();
                        local_640 = local_15e0;
                        local_650 = 0;
                        local_468 = local_648;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                   (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                    in_stack_ffffffffffffe068),
                                   (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060));
                        tVar4 = boost::multiprecision::operator>=
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffe058,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x3e0ed7);
                        if (tVar4) {
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                    (in_RDI,(char (*) [23])"IMAISM75 LP unbounded\n");
                          local_84c = UNBOUNDED;
                          local_15e4 = 1;
                          goto LAB_003e2682;
                        }
                        pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060),
                                          (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                        SPxOut::
                        debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                  (in_RDI,(char (*) [73])
                                          "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n"
                                   ,&local_c50,&local_c54,pnVar15);
                        operator_new(0x30);
                        local_1641 = 1;
                        local_510 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                        local_508 = local_1630;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                      (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                        std::shared_ptr<soplex::Tolerances>::shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)
                                   CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
                        FixBoundsPS::FixBoundsPS
                                  (in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,
                                   (int)((ulong)in_stack_ffffffffffffe3b0 >> 0x20),
                                   in_stack_ffffffffffffe3a8,
                                   (shared_ptr<soplex::Tolerances> *)
                                   CONCAT17(in_stack_ffffffffffffe3a7,
                                            CONCAT16(in_stack_ffffffffffffe3a6,
                                                     in_stack_ffffffffffffe3a0)));
                        local_1641 = 0;
                        std::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                        ::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                  ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (FixBoundsPS *)in_stack_ffffffffffffe058);
                        std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)0x3e106c);
                        Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                 (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                  *)in_stack_ffffffffffffe058);
                        pDVar3 = local_860;
                        iVar6 = local_c50;
                        pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060),
                                          (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                        (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,pnVar15,0);
                        std::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                        ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                       *)0x3e10eb);
                      }
                    }
                    else {
                      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                              (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                      local_618 = infinity();
                      local_610 = local_1724;
                      local_620 = 0;
                      local_478 = local_618;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<50U,_int,_void> *)
                                 CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                 (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                  in_stack_ffffffffffffe068),
                                 (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                  in_stack_ffffffffffffe060));
                      tVar4 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffe058,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x3e15d3);
                      if (tVar4) {
                        local_1728 = cpp_dec_float_finite;
                        tVar4 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068),
                                           (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                           in_stack_ffffffffffffe060));
                        local_1e43 = false;
                        if (tVar4) {
                          local_172c._0_1_ = false;
                          local_172c._1_3_ = 0;
                          local_1e43 = boost::multiprecision::operator>
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffe06c,
                                                             in_stack_ffffffffffffe068),
                                                  (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                                  in_stack_ffffffffffffe060));
                        }
                        if (local_1e43 == false) {
                          in_stack_ffffffffffffe157 =
                               boost::multiprecision::operator>
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                          (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060));
                          in_stack_ffffffffffffe156 = false;
                          if ((bool)in_stack_ffffffffffffe157) {
                            in_stack_ffffffffffffe155 =
                                 boost::multiprecision::operator<
                                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)CONCAT44(in_stack_ffffffffffffe06c,
                                                        in_stack_ffffffffffffe068),
                                            (int *)CONCAT44(in_stack_ffffffffffffe064,
                                                            in_stack_ffffffffffffe060));
                            in_stack_ffffffffffffe156 = in_stack_ffffffffffffe155;
                          }
                          if ((type_conflict5)in_stack_ffffffffffffe156 != false) {
                            in_stack_ffffffffffffe148 =
                                 SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(in_stack_ffffffffffffe064,
                                                     in_stack_ffffffffffffe060),
                                         (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                            puVar16 = (ulong *)infinity();
                            local_1810 = (DLPSV *)(*puVar16 ^ 0x8000000000000000);
                            local_5e0 = local_1804;
                            local_5e8 = &local_1810;
                            local_5f0 = 0;
                            local_488 = local_5e8;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<50U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070)
                                       ,(double)CONCAT44(in_stack_ffffffffffffe06c,
                                                         in_stack_ffffffffffffe068),
                                       (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060));
                            in_stack_ffffffffffffe147 =
                                 boost::multiprecision::operator<=
                                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)in_stack_ffffffffffffe058,
                                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)0x3e1ad1);
                            if ((bool)in_stack_ffffffffffffe147) {
                              SPxOut::
                              debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                        (in_RDI,(char (*) [23])"IMAISM78 LP unbounded\n");
                              local_84c = UNBOUNDED;
                              local_15e4 = 1;
                              goto LAB_003e2682;
                            }
                            pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                      (in_RDI,(char (*) [73])
                                              "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                       ,&local_c50,&local_c54,pnVar15);
                            operator_new(0x30);
                            local_1869 = 1;
                            in_stack_ffffffffffffe118 = local_860;
                            in_stack_ffffffffffffe124 = local_c50;
                            local_4e0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffe064,
                                                            in_stack_ffffffffffffe060),
                                                (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                            in_stack_ffffffffffffe108 =
                                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&stack0xffffffffffffe7a8;
                            local_4d8 = in_stack_ffffffffffffe108;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                          (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058
                                         );
                            in_stack_ffffffffffffe110 = (DuplicateColsPS *)&stack0xffffffffffffe798;
                            std::shared_ptr<soplex::Tolerances>::shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)
                                       CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                                       ,(shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058)
                            ;
                            FixBoundsPS::FixBoundsPS
                                      (in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,
                                       (int)((ulong)in_stack_ffffffffffffe3b0 >> 0x20),
                                       in_stack_ffffffffffffe3a8,
                                       (shared_ptr<soplex::Tolerances> *)
                                       CONCAT17(in_stack_ffffffffffffe3a7,
                                                CONCAT16(in_stack_ffffffffffffe3a6,
                                                         in_stack_ffffffffffffe3a0)));
                            local_1869 = 0;
                            std::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                            ::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                      ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                        *)CONCAT44(in_stack_ffffffffffffe064,
                                                   in_stack_ffffffffffffe060),
                                       (FixBoundsPS *)in_stack_ffffffffffffe058);
                            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)0x3e1c66);
                            Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                            ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),
                                     (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)in_stack_ffffffffffffe058);
                            in_stack_ffffffffffffe0f0 = local_860;
                            in_stack_ffffffffffffe0fc = local_c50;
                            in_stack_ffffffffffffe100 =
                                 (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                            (**(code **)(*(long *)in_stack_ffffffffffffe0f0 + 0x168))
                                      (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0fc,
                                       in_stack_ffffffffffffe100,0);
                            std::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                           *)0x3e1ce5);
                          }
                        }
                        else {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          local_600 = infinity();
                          local_5f8 = local_1764;
                          local_608 = 0;
                          local_480 = local_600;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                                     (double)CONCAT44(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068),
                                     (type *)CONCAT44(in_stack_ffffffffffffe064,
                                                      in_stack_ffffffffffffe060));
                          tVar4 = boost::multiprecision::operator>=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffe058,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x3e1702);
                          if (tVar4) {
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                      (in_RDI,(char (*) [23])"IMAISM77 LP unbounded\n");
                            local_84c = UNBOUNDED;
                            local_15e4 = 1;
                            goto LAB_003e2682;
                          }
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[75],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                    (in_RDI,(char (*) [75])
                                            "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n"
                                     ,&local_c50,&local_c54,pnVar15);
                          operator_new(0x30);
                          local_4f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffe064,
                                                          in_stack_ffffffffffffe060),
                                              (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          in_stack_ffffffffffffe170 = local_17b0;
                          local_4e8 = in_stack_ffffffffffffe170;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),
                                        (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                          std::shared_ptr<soplex::Tolerances>::shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
                          FixBoundsPS::FixBoundsPS
                                    (in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,
                                     (int)((ulong)in_stack_ffffffffffffe3b0 >> 0x20),
                                     in_stack_ffffffffffffe3a8,
                                     (shared_ptr<soplex::Tolerances> *)
                                     CONCAT17(in_stack_ffffffffffffe3a7,
                                              CONCAT16(in_stack_ffffffffffffe3a6,
                                                       in_stack_ffffffffffffe3a0)));
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                          ::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060
                                                ),(FixBoundsPS *)in_stack_ffffffffffffe058);
                          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)0x3e1897);
                          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)in_stack_ffffffffffffe058);
                          pDVar3 = local_860;
                          iVar6 = local_c50;
                          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffe064,
                                                        in_stack_ffffffffffffe060),
                                            (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                          (**(code **)(*(long *)pDVar3 + 0x150))(pDVar3,iVar6,pnVar15,0);
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                         *)0x3e1916);
                        }
                      }
                    }
                    in_stack_ffffffffffffe0e8 =
                         &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                  (int)((ulong)in_stack_ffffffffffffe058 >> 0x20))->m_backend;
                    local_4c8 = local_18a4;
                    local_4d0 = in_stack_ffffffffffffe0e8;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                    local_4c0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_ffffffffffffe064,
                                                    in_stack_ffffffffffffe060),
                                        (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
                    local_4b8 = local_18dc;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe058);
                    feastol(in_stack_ffffffffffffe098);
                    bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT17(in_stack_ffffffffffffe157,
                                                   CONCAT16(in_stack_ffffffffffffe156,
                                                            CONCAT15(in_stack_ffffffffffffe155,
                                                                     in_stack_ffffffffffffe150))),
                                       in_stack_ffffffffffffe148,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT17(in_stack_ffffffffffffe147,
                                                   in_stack_ffffffffffffe140));
                    if (bVar5) {
                      pbVar13 = DataArray<bool>::operator[](local_b40,local_c50);
                      *pbVar13 = true;
                      pbVar13 = DataArray<bool>::operator[]
                                          ((DataArray<bool> *)(local_c40 + 0xe8),local_c50);
                      *pbVar13 = true;
                      piVar9 = DataArray<int>::operator[](&in_RDI->m_stat,0xd);
                      *piVar9 = *piVar9 + 1;
                    }
                  }
                }
                local_c4c = local_c4c + 1;
              }
              local_c48 = local_c48 + 1;
            }
          }
        }
      }
      local_1918 = 0;
      while( true ) {
        uVar18 = local_1918;
        iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3e1f1f);
        iVar7 = (int)((ulong)in_stack_ffffffffffffe098 >> 0x20);
        if (iVar6 <= (int)uVar18) break;
        pbVar13 = DataArray<bool>::operator[]((DataArray<bool> *)(local_c40 + 0xe8),local_1918);
        if ((*pbVar13 & 1U) != 0) {
          fixColumn(in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe804,
                    (bool)in_stack_ffffffffffffe803);
        }
        local_1918 = local_1918 + 1;
      }
      local_191c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x3e1f94);
      local_1928 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffe0a0,iVar7);
      for (local_192c = 0; local_192c < (int)local_191c; local_192c = local_192c + 1) {
        pbVar13 = DataArray<bool>::operator[](local_b40,local_192c);
        if ((*pbVar13 & 1U) == 0) {
          *(undefined4 *)(local_1928 + (long)local_192c * 4) = 0;
        }
        else {
          *(undefined4 *)(local_1928 + (long)local_192c * 4) = 0xffffffff;
          local_86c = local_86c + 1;
          pSVar14 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                                (int)((ulong)in_stack_ffffffffffffe058 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar14);
          local_870 = iVar6 + local_870;
        }
      }
      (**(code **)(*(long *)local_860 + 0xb8))(local_860,local_1928);
      for (local_1930 = cpp_dec_float_finite; (int)local_1930 < (int)local_191c;
          local_1930 = local_1930 + cpp_dec_float_inf) {
        if (-1 < *(int *)(local_1928 + (long)(int)local_1930 * 4)) {
          piVar9 = DataArray<int>::operator[](&in_RDI->m_cIdx,local_1930);
          iVar6 = *piVar9;
          piVar9 = DataArray<int>::operator[]
                             (&in_RDI->m_cIdx,*(int *)(local_1928 + (long)(int)local_1930 * 4));
          *piVar9 = iVar6;
        }
      }
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068,
                 (Real)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      for (local_194c = 0; uVar19 = (undefined2)((ulong)in_stack_ffffffffffffe0e8 >> 0x30),
          (int)local_194c < (int)local_191c; local_194c = local_194c + 1) {
        iVar6 = *(int *)(local_1928 + (long)(int)local_194c * 4);
        piVar9 = DataArray<int>::operator[](&local_1948,local_194c);
        *piVar9 = iVar6;
      }
      pDVar17 = in_stack_ffffffffffffe058;
      if ((local_c40[0x9f] & 1) != 0) {
        operator_new(0x168);
        local_19a0._0_4_ = 0;
        local_19a0._4_4_ = 0x3ff00000;
        local_5c8 = local_1998;
        local_5d0 = &local_19a0;
        local_5d8 = 0;
        local_490 = local_5d0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                   (double)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (type *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
        DataArray<int>::DataArray
                  ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffe077,in_stack_ffffffffffffe070),
                   (DataArray<int> *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068));
        pDVar17 = (DuplicateColsPS *)&stack0xffffffffffffe638;
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                   (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe058);
        in_stack_ffffffffffffe068 = 1;
        in_stack_ffffffffffffe060 = 0;
        DuplicateColsPS::DuplicateColsPS
                  (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
                   (int)((ulong)in_stack_ffffffffffffe100 >> 0x20),(int)in_stack_ffffffffffffe100,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffe0fc,in_stack_ffffffffffffe0f8),
                   in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe170,SUB21((ushort)uVar19 >> 8,0),
                   SUB21(uVar19,0));
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
        ::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                  ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),pDVar17);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e2300)
        ;
        DataArray<int>::~DataArray
                  ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
        Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
        ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                 (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)pDVar17);
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
        ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                       *)0x3e2338);
      }
      spx_free<int*>((int **)0x3e23ed);
      if (0 < local_86c) {
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remCols = local_86c +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remCols;
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remNzos = local_870 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remNzos;
        if (((in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout != (SPxOut *)0x0) &&
           (VVar8 = SPxOut::getVerbosity
                              ((in_RDI->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout), 3 < (int)VVar8)) {
          SPxOut::getVerbosity
                    ((in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          local_19d4 = 4;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_19d4);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(char *)pDVar17);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(int)((ulong)pDVar17 >> 0x20));
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(char *)pDVar17);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(int)((ulong)pDVar17 >> 0x20));
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(char *)pDVar17);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060)
                             ,(_func_ostream_ptr_ostream_ptr *)pDVar17);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&stack0xffffffffffffe630);
        }
        local_30 = &(in_RDI->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction;
        local_38 = &local_191c;
        local_28 = local_1a0c;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_1a0c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)(int)*local_38;
        local_8 = local_1a0c;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
                   (cpp_dec_float<50U,_int,_void> *)pDVar17,(longlong *)0x3e2618);
        tVar4 = boost::multiprecision::operator>
                          ((int *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
        if (tVar4) {
          *local_868 = 1;
        }
      }
      local_84c = OKAY;
      local_15e4 = 1;
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
LAB_003e2682:
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      IdxSet::~IdxSet((IdxSet *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x3e26c3);
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060));
    }
  }
  return local_84c;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}